

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManage.cpp
# Opt level: O0

void init_get_head(int type,MemoryNode **free,MemoryNode **used)

{
  MemoryNode **used_local;
  MemoryNode **free_local;
  int type_local;
  
  if (type == 0) {
    *used = data_used_memory_head;
    *free = data_free_memory_head;
  }
  if (type == 1) {
    *used = code_used_memory_head;
    *free = code_free_memory_head;
  }
  return;
}

Assistant:

void init_get_head(int type, MemoryNode *&free, MemoryNode *&used) {
	if (type == 0) {
		used = data_used_memory_head;
		free= data_free_memory_head;
	}
	if (type == 1) {
		used = code_used_memory_head;
		free = code_free_memory_head;
	}
}